

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_states.cpp
# Opt level: O1

void __thiscall duckdb::WindowAggregateStates::Finalize(WindowAggregateStates *this,Vector *result)

{
  aggregate_finalize_t p_Var1;
  FunctionDataWrapper *pFVar2;
  type pVVar3;
  AggregateInputData aggr_input_data;
  AggregateInputData local_38;
  
  if ((this->aggr).bind_data_wrapper.internal.
      super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_38.bind_data.ptr = (FunctionData *)0x0;
  }
  else {
    pFVar2 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                       (&(this->aggr).bind_data_wrapper);
    local_38.bind_data.ptr =
         (pFVar2->function_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  }
  local_38.allocator = &this->allocator;
  local_38.combine_type = PRESERVE_INPUT;
  p_Var1 = (this->aggr).function.finalize;
  pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                     (&this->statef);
  (*p_Var1)(pVVar3,&local_38,result,
            (ulong)((long)(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                          .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(this->states).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start) / this->state_size,0);
  return;
}

Assistant:

void WindowAggregateStates::Finalize(Vector &result) {
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	aggr.function.finalize(*statef, aggr_input_data, result, GetCount(), 0);
}